

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

void tty_cmd(void)

{
  if (0x7f < (*(ushort *)DLTTYPortCmd & 0xff)) {
    if (((uint)*DLTTYPortCmd & 0xff) == 0x80) {
      tty_put();
    }
    else if (((uint)*DLTTYPortCmd & 0xff) == 0x81) {
      tty_setparam();
    }
    else if (((uint)*DLTTYPortCmd & 0xff) == 0x83) {
      tty_open();
    }
    else if (((uint)*DLTTYPortCmd & 0xff) == 0x84) {
      tty_close();
    }
    else if (((uint)*DLTTYPortCmd & 0xff) == 0x86) {
      tty_breakon();
    }
    else if (((uint)*DLTTYPortCmd & 0xff) == 0x87) {
      tty_breakoff();
    }
    else {
      error("TTY: tty_cmd");
    }
    *(ushort *)DLTTYPortCmd = *(ushort *)DLTTYPortCmd & 0xff00 | *(ushort *)DLTTYPortCmd & 0x7f;
  }
  return;
}

Assistant:

void tty_cmd(void)
{
  if (DLTTYPortCmd->command >= PUT_CHAR) {
    if (DLTTYPortCmd->command == PUT_CHAR)
      tty_put();
    else if (DLTTYPortCmd->command == SET_PARAM)
      tty_setparam();
    else if (DLTTYPortCmd->command == TTY_ON)
      tty_open();
    else if (DLTTYPortCmd->command == TTY_OFF)
      tty_close();
    else if (DLTTYPortCmd->command == TTY_BREAK_ON)
      tty_breakon();
    else if (DLTTYPortCmd->command == TTY_BREAK_OFF)
      tty_breakoff();
    else
      error("TTY: tty_cmd");

    DLTTYPortCmd->command &= ~PUT_CHAR;
  }
}